

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_getfenv(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  cTValue *pcVar3;
  GCRef *pGVar4;
  int level;
  int local_c;
  
  pcVar3 = L->base;
  if ((L->top <= pcVar3) || ((pcVar3->field_2).it != 0xfffffff7)) {
    local_c = 1;
    if ((pcVar3 < L->top) && ((pcVar3->field_2).it != 0xffffffff)) {
      local_c = lj_lib_checkint(L,1);
    }
    pcVar3 = lj_debug_frame(L,local_c,&local_c);
    if (pcVar3 == (cTValue *)0x0) {
      lj_err_arg(L,1,LJ_ERR_INVLVL);
    }
  }
  uVar1 = (pcVar3->u32).lo;
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  pGVar4 = &L->env;
  if (*(char *)((ulong)uVar1 + 6) == '\0') {
    pGVar4 = (GCRef *)((ulong)uVar1 + 8);
  }
  (pTVar2->field_2).field_0 =
       (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)pGVar4->gcptr32;
  (pTVar2->field_2).it = 0xfffffff4;
  return 1;
}

Assistant:

LJLIB_CF(getfenv)
{
  GCfunc *fn;
  cTValue *o = L->base;
  if (!(o < L->top && tvisfunc(o))) {
    int level = lj_lib_optint(L, 1, 1);
    o = lj_debug_frame(L, level, &level);
    if (o == NULL)
      lj_err_arg(L, 1, LJ_ERR_INVLVL);
  }
  fn = &gcval(o)->fn;
  settabV(L, L->top++, isluafunc(fn) ? tabref(fn->l.env) : tabref(L->env));
  return 1;
}